

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QRect __thiscall QToolBarAreaLayout::itemRect(QToolBarAreaLayout *this,QList<int> *path)

{
  int iVar1;
  Data *pDVar2;
  CutResult CVar3;
  LayoutDirection direction;
  long in_FS_OFFSET;
  QRect QVar4;
  QArrayData *d;
  qsizetype l;
  qsizetype p;
  QList<int> local_78;
  undefined1 local_58 [16];
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = 1;
  local_48 = -1;
  CVar3 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
  if (CVar3 < Full) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (int *)0x0;
    local_78.d.size = 0;
  }
  else if (CVar3 == Full) {
    local_78.d.d = (path->d).d;
    local_78.d.ptr = (path->d).ptr;
    local_78.d.size = (path->d).size;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (int *)QArrayData::allocate((QArrayData **)&local_78,4,0x10,local_48,KeepSize);
    local_78.d.size = local_48;
    pDVar2 = local_78.d.d;
    if (local_48 != 0) {
      memcpy(local_78.d.ptr,(path->d).ptr + local_40,local_48 * 4);
    }
    local_78.d.d = pDVar2;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,4,0x10);
      }
    }
  }
  local_58 = (undefined1  [16])QToolBarAreaLayoutInfo::itemRect(this->docks + iVar1,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
    }
  }
  QVar4 = (QRect)local_58;
  if (this->docks[iVar1].o == Horizontal) {
    direction = QWidget::layoutDirection(&this->mainWindow->super_QWidget);
    QVar4 = QStyle::visualRect(direction,&this->docks[iVar1].rect,(QRect *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar4;
}

Assistant:

QRect QToolBarAreaLayout::itemRect(const QList<int> &path) const
{
    const int i = path.first();

    QRect r = docks[i].itemRect(path.mid(1));
    if (docks[i].o == Qt::Horizontal)
        r = QStyle::visualRect(mainWindow->layoutDirection(),
                                docks[i].rect, r);
    return r;
}